

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TablePrinter.hpp
# Opt level: O2

void __thiscall trl::TablePrinter::PrintHeader(TablePrinter *this)

{
  ostream *poVar1;
  reference pvVar2;
  reference pvVar3;
  uint uVar4;
  size_type __n;
  string local_50 [32];
  
  PrintHorizontalLine(this,'=');
  std::operator<<(this->m_outStream,"|");
  for (__n = 0; (long)__n <
                (long)(int)((ulong)((long)(this->m_columnTitles).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->m_columnTitles).
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 5);
      __n = __n + 1) {
    poVar1 = this->m_outStream;
    uVar4 = 0x80;
    if (this->m_flushLeft != false) {
      uVar4 = 0x20;
    }
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         uVar4 | *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffff4f;
    pvVar2 = std::vector<int,_std::allocator<int>_>::at(&this->m_columnWidths,__n);
    *(long *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = (long)*pvVar2;
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(&this->m_columnTitles,__n);
    std::vector<int,_std::allocator<int>_>::at(&this->m_columnWidths,__n);
    std::__cxx11::string::substr((ulong)local_50,(ulong)pvVar3);
    std::operator<<(poVar1,local_50);
    std::__cxx11::string::~string(local_50);
    if (__n != (int)((ulong)((long)(this->m_columnTitles).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_columnTitles).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1) {
      std::operator<<(this->m_outStream,(string *)&this->m_columnSeparator);
    }
  }
  std::operator<<(this->m_outStream,"|\n");
  PrintHorizontalLine(this,'=');
  return;
}

Assistant:

void PrintHeader() {

            PrintHorizontalLine('=');
            m_outStream << "|";

            for (int i = 0; i < GetColumnCount(); ++i) {

                if (m_flushLeft)
                    m_outStream << std::left;
                else
                    m_outStream << std::right;

                m_outStream << std::setw(m_columnWidths.at(i)) << m_columnTitles.at(i).substr(0, m_columnWidths.at(i));
                if (i != GetColumnCount() - 1) {
                    m_outStream << m_columnSeparator;
                }
            }

            m_outStream << "|\n";
            PrintHorizontalLine('=');
        }